

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U>::insert
          (SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U> *this,uint *key)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  
  uVar2 = *key;
  if (uVar2 == 0) {
    __assert_fail("key != Key()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0xd9,
                  "void SmallDenseSet<unsigned int, SmallDenseMapUnsignedHasher, 32>::insert(const Key &) [Key = unsigned int, Hasher = SmallDenseMapUnsignedHasher, N = 32]"
                 );
  }
  uVar3 = this->bucketCount;
  if (uVar3 <= (this->count >> 2) + this->count) {
    rehash(this);
    uVar3 = this->bucketCount;
    uVar2 = *key;
  }
  uVar4 = uVar2 * -0x61c88647;
  iVar5 = 1;
  while( true ) {
    if (iVar5 - uVar3 == 1) {
      __assert_fail("!\"couldn\'t insert node\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                    ,0xf5,
                    "void SmallDenseSet<unsigned int, SmallDenseMapUnsignedHasher, 32>::insert(const Key &) [Key = unsigned int, Hasher = SmallDenseMapUnsignedHasher, N = 32]"
                   );
    }
    uVar4 = uVar4 & uVar3 - 1;
    uVar1 = this->data[uVar4];
    if (uVar1 == 0) break;
    if (uVar1 == uVar2) {
      return;
    }
    uVar4 = uVar4 + iVar5;
    iVar5 = iVar5 + 1;
  }
  this->data[uVar4] = uVar2;
  this->count = this->count + 1;
  return;
}

Assistant:

void insert(const Key& key)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Key &item = data[bucket];

			if(item == Key())
			{
				item = key;

				count++;
				return;
			}

			if(item == key)
				return;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}